

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_dophase_done(Curl_easy *data,_Bool connected)

{
  int local_3c;
  CURLcode result;
  int completed;
  ftp_conn *ftpc;
  FTP *ftp;
  connectdata *conn;
  Curl_easy *pCStack_18;
  _Bool connected_local;
  Curl_easy *data_local;
  
  ftp = (FTP *)data->conn;
  ftpc = (ftp_conn *)(data->req).p.file;
  _result = &((connectdata *)ftp)->proto;
  conn._7_1_ = connected;
  pCStack_18 = data;
  if ((connected) && (data_local._4_4_ = ftp_do_more(data,&local_3c), data_local._4_4_ != CURLE_OK))
  {
    close_secondarysocket(pCStack_18);
  }
  else {
    if (*(int *)&(ftpc->pp).sendthis == 0) {
      if ((conn._7_1_ & 1) == 0) {
        ftp[0x1d].downloadsize = ftp[0x1d].downloadsize & 0xffffffffffffefffU | 0x1000;
      }
    }
    else {
      Curl_xfer_setup_nop(pCStack_18);
    }
    *(byte *)((long)_result + 0x112) = *(byte *)((long)_result + 0x112) & 0xfb | 4;
    data_local._4_4_ = CURLE_OK;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode ftp_dophase_done(struct Curl_easy *data, bool connected)
{
  struct connectdata *conn = data->conn;
  struct FTP *ftp = data->req.p.ftp;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  if(connected) {
    int completed;
    CURLcode result = ftp_do_more(data, &completed);

    if(result) {
      close_secondarysocket(data);
      return result;
    }
  }

  if(ftp->transfer != PPTRANSFER_BODY)
    /* no data to transfer */
    Curl_xfer_setup_nop(data);
  else if(!connected)
    /* since we did not connect now, we want do_more to get called */
    conn->bits.do_more = TRUE;

  ftpc->ctl_valid = TRUE; /* seems good */

  return CURLE_OK;
}